

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O2

void __thiscall
sptk::reaper::EpochTracker::GetFilledEpochs
          (EpochTracker *this,float unvoiced_pm_interval,
          vector<float,_std::allocator<float>_> *times,
          vector<short,_std::allocator<short>_> *voicing)

{
  pointer pfVar1;
  pointer psVar2;
  pointer pTVar3;
  ulong uVar4;
  int32_t *piVar5;
  int iVar6;
  int32_t i_old;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float time;
  short local_54 [2];
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  ulong local_40;
  EpochTracker *local_38;
  
  pfVar1 = (times->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((times->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pfVar1) {
    (times->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pfVar1;
  }
  psVar2 = (voicing->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((voicing->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
      _M_finish != psVar2) {
    (voicing->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
    _M_finish = psVar2;
  }
  local_50 = (float)(ulong)((long)(this->norm_residual_).
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)(this->norm_residual_).
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 2) / this->sample_rate_;
  uVar4 = (ulong)((int)((ulong)((long)(this->output_).
                                      super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->output_).
                                     super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1);
  local_4c = unvoiced_pm_interval;
  local_40 = uVar4;
  local_38 = this;
  do {
    uVar7 = (uint)uVar4;
    if ((int)uVar7 < 0) {
      return;
    }
    pTVar3 = (this->output_).
             super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
             ._M_impl.super__Vector_impl_data._M_start;
    time = (float)pTVar3[uVar4].resid_index / this->sample_rate_;
    if ((pTVar3[uVar4].voiced != false) ||
       ((uVar8 = uVar7, (int)uVar7 < (int)(uint)local_40 && (pTVar3[uVar4 + 1].voiced == true)))) {
      std::vector<float,_std::allocator<float>_>::push_back(times,&time);
      local_54[1] = 1;
      std::vector<short,_std::allocator<short>_>::emplace_back<short>(voicing,local_54 + 1);
      uVar8 = uVar7 - 1;
    }
    if (uVar8 == (uint)local_40) {
      time = 0.0;
    }
    if (0 < (int)uVar8) {
      uVar4 = (ulong)uVar8;
      pTVar3 = (this->output_).
               super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pTVar3[uVar4].voiced == false) && (time < local_50)) {
        piVar5 = &pTVar3[uVar4].resid_index;
        for (; 0 < (long)uVar4; uVar4 = uVar4 - 1) {
          if (((TrackerResults *)(piVar5 + -2))->voiced != false) {
            local_48 = -1.0 / this->max_f0_search_ + (float)*piVar5 / this->sample_rate_;
            uVar8 = (uint)uVar4;
            goto LAB_0010d8da;
          }
          piVar5 = piVar5 + -4;
        }
        uVar8 = 0;
        local_48 = local_50;
LAB_0010d8da:
        iVar6 = 2;
        local_44 = time + local_4c;
        while (this = local_38, local_44 < local_48) {
          std::vector<float,_std::allocator<float>_>::push_back(times,&local_44);
          local_54[0] = 0;
          std::vector<short,_std::allocator<short>_>::emplace_back<short>(voicing,local_54);
          fVar9 = (float)iVar6;
          iVar6 = iVar6 + 1;
          local_44 = fVar9 * local_4c + time;
        }
      }
    }
    uVar4 = (ulong)(uVar8 - (uVar8 == uVar7));
  } while( true );
}

Assistant:

void EpochTracker::GetFilledEpochs(float unvoiced_pm_interval,
                                   std::vector<float>* times,
                                   std::vector<int16_t>* voicing) {
  times->clear();
  voicing->clear();
  float final_time = norm_residual_.size() / sample_rate_;
  int32_t limit = output_.size() - 1;
  int32_t i = limit;
  // Produce the output in normal time order.
  while (i >= 0) {
    int32_t i_old = i;
    float time = output_[i].resid_index / sample_rate_;
    // Note that the pulse locations of both the beginning and end
    // of any voiced period are of interest.
    if (output_[i].voiced || ((i < limit) && (output_[i+1].voiced))) {
      times->push_back(time);
      voicing->push_back(1);
      i--;
    }
    if (i == limit) {
      time = 0.0;
    }
    if ((i > 0) && (!output_[i].voiced) && (time < final_time)) {
      for ( ; i > 0; --i) {
        if (output_[i].voiced) {
          break;
        }
      }
      float next_time = final_time;
      int32_t fill_ind = 1;
      if (i > 0) {
        next_time = (output_[i].resid_index / sample_rate_) -
            (1.0 / max_f0_search_);
      }
      float now = time + (fill_ind * unvoiced_pm_interval);
      while (now < next_time) {
        times->push_back(now);
        voicing->push_back(0);
        fill_ind++;
        now = time + (fill_ind * unvoiced_pm_interval);
      }
    }
    if (i == i_old) {
      i--;
    }
  }
}